

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O3

Token * __thiscall wabt::WastLexer::GetKeywordToken(Token *__return_storage_ptr__,WastLexer *this)

{
  char *pcVar1;
  TokenType token_type;
  Location loc;
  Location loc_00;
  TokenInfo *pTVar2;
  anon_class_8_1_8991fb9c column;
  uint uVar3;
  uint uVar6;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar7;
  uint uVar8;
  undefined4 uStack_34;
  undefined4 uStack_14;
  
  ReadReservedChars(this);
  pTVar2 = anon_unknown_8::Perfect_Hash::InWordSet
                     (this->token_start_,(long)this->cursor_ - (long)this->token_start_);
  if (pTVar2 == (TokenInfo *)0x0) {
    TextToken(__return_storage_ptr__,this,Reserved,0);
  }
  else {
    token_type = pTVar2->token_type;
    if (token_type < First_Literal) {
      BareToken(__return_storage_ptr__,this,token_type);
    }
    else if (token_type - First_Type < 4) {
      pcVar1 = this->line_start_;
      auVar4._8_4_ = (int)pcVar1;
      auVar4._0_8_ = pcVar1;
      auVar4._12_4_ = (int)((ulong)pcVar1 >> 0x20);
      uVar3 = (int)((long)this->token_start_ - (long)pcVar1) + 1;
      uVar6 = (int)((long)this->cursor_ - auVar4._8_8_) + 1;
      uVar7 = -(uint)(1 < (int)uVar3);
      uVar8 = -(uint)(1 < (int)uVar6);
      loc.field_1.field_0.first_column = ~uVar7 & 1 | uVar3 & uVar7;
      loc.field_1.field_0.line = this->line_;
      loc.field_1._12_4_ = uStack_14;
      loc.field_1.field_0.last_column = ~uVar8 & 1 | uVar6 & uVar8;
      loc.filename._M_str = (this->filename_)._M_dataplus._M_p;
      loc.filename._M_len = (this->filename_)._M_string_length;
      Token::Token(__return_storage_ptr__,loc,token_type,(pTVar2->field_2).value_type);
    }
    else {
      if (0x46 < token_type - AtomicFence) {
        __assert_fail("IsTokenTypeOpcode(info->token_type)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-lexer.cc"
                      ,0x271,"Token wabt::WastLexer::GetKeywordToken()");
      }
      pcVar1 = this->line_start_;
      auVar5._8_4_ = (int)pcVar1;
      auVar5._0_8_ = pcVar1;
      auVar5._12_4_ = (int)((ulong)pcVar1 >> 0x20);
      uVar3 = (int)((long)this->token_start_ - (long)pcVar1) + 1;
      uVar6 = (int)((long)this->cursor_ - auVar5._8_8_) + 1;
      uVar7 = -(uint)(1 < (int)uVar3);
      uVar8 = -(uint)(1 < (int)uVar6);
      loc_00.field_1.field_0.first_column = ~uVar7 & 1 | uVar3 & uVar7;
      loc_00.field_1.field_0.line = this->line_;
      loc_00.field_1._12_4_ = uStack_34;
      loc_00.field_1.field_0.last_column = ~uVar8 & 1 | uVar6 & uVar8;
      loc_00.filename._M_str = (this->filename_)._M_dataplus._M_p;
      loc_00.filename._M_len = (this->filename_)._M_string_length;
      Token::Token(__return_storage_ptr__,loc_00,token_type,(Opcode)(pTVar2->field_2).opcode.enum_);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::GetKeywordToken() {
  ReadReservedChars();
  TokenInfo* info =
      Perfect_Hash::InWordSet(token_start_, cursor_ - token_start_);
  if (!info) {
    return TextToken(TokenType::Reserved);
  }
  if (IsTokenTypeBare(info->token_type)) {
    return BareToken(info->token_type);
  } else if (IsTokenTypeType(info->token_type) ||
             IsTokenTypeRefKind(info->token_type)) {
    return Token(GetLocation(), info->token_type, info->value_type);
  } else {
    assert(IsTokenTypeOpcode(info->token_type));
    return Token(GetLocation(), info->token_type, info->opcode);
  }
}